

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixgbe.cpp
# Opt level: O3

void __thiscall ixy::IxgbeDevice::start_tx_queue(IxgbeDevice *this,uint16_t queue_id)

{
  uint8_t *puVar1;
  undefined2 uVar2;
  pointer piVar3;
  int iVar4;
  int *piVar5;
  ulong uVar6;
  ulong uVar7;
  ushort local_7a;
  uint local_78;
  uint local_74;
  long local_70;
  LogData<ixy::Pair<ixy::Pair<ixy::None,_const_char_*>,_const_unsigned_short_&>_> local_68;
  char *local_50;
  long *local_48;
  char *local_40;
  uint *local_38;
  
  local_68.list.second = &local_7a;
  local_68.list.first.second = "starting tx queue ";
  local_7a = queue_id;
  debug<ixy::Pair<ixy::Pair<ixy::None,char_const*>,unsigned_short_const&>>
            ("/workspace/llm4binary/github/license_c_cmakelists/ixy-languages[P]ixy/src/ixgbe.cpp",
             0x107,"start_tx_queue",&local_68);
  uVar7 = (ulong)local_7a;
  piVar3 = (this->tx_queues).
           super__Vector_base<ixy::ixgbe_tx_queue,_std::allocator<ixy::ixgbe_tx_queue>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar6 = ((long)(this->tx_queues).
                 super__Vector_base<ixy::ixgbe_tx_queue,_std::allocator<ixy::ixgbe_tx_queue>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)piVar3 >> 4) * 0x6db6db6db6db6db7
  ;
  if (uVar7 <= uVar6 && uVar6 - uVar7 != 0) {
    uVar2 = piVar3[uVar7].num_entries;
    if ((uVar2 & uVar2 - 1) != 0) {
      local_68.list.first.second = "number of queue entries must be a power of 2";
      error<ixy::Pair<ixy::None,char_const*>>
                ("/workspace/llm4binary/github/license_c_cmakelists/ixy-languages[P]ixy/src/ixgbe.cpp"
                 ,0x10a,"start_tx_queue",(LogData<ixy::Pair<ixy::None,_const_char_*>_> *)&local_68);
    }
    uVar6 = (ulong)local_7a * 0x40 + 0x6010;
    if (uVar6 <= this->len - 4) {
      puVar1 = this->addr + uVar6;
      puVar1[0] = '\0';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      uVar6 = (ulong)local_7a * 0x40 + 0x6018;
      if (uVar6 <= this->len - 4) {
        puVar1 = this->addr + uVar6;
        puVar1[0] = '\0';
        puVar1[1] = '\0';
        puVar1[2] = '\0';
        puVar1[3] = '\0';
        uVar6 = (ulong)local_7a * 0x40 + 0x6028;
        if (this->len - 4 < uVar6) goto LAB_0010782c;
        if (uVar6 <= this->len - 4) {
          *(uint *)(this->addr + uVar6) = *(uint *)(this->addr + uVar6) | 0x2000000;
          local_70 = (ulong)local_7a * 0x40 + 0x6028;
          local_74 = 0x2000000;
          local_78 = *(uint *)(this->addr + (ulong)local_7a * 0x40 + 0x6028);
          if ((local_78 >> 0x19 & 1) == 0) {
            do {
              local_68.list.first.second = "waiting for flags ";
              local_68.list.second = (unsigned_short *)&local_74;
              local_50 = " in register ";
              local_48 = &local_70;
              local_40 = ", current value ";
              local_38 = &local_78;
              debug<ixy::Pair<ixy::Pair<ixy::Pair<ixy::Pair<ixy::Pair<ixy::Pair<ixy::None,char_const*>,unsigned_int_const&>,char_const*>,unsigned_long_const&>,char_const*>,unsigned_int_const&>>
                        ("/workspace/llm4binary/github/license_c_cmakelists/ixy-languages[P]ixy/src/ixgbe.cpp"
                         ,0x1ee,"wait_set_reg32",
                         (LogData<ixy::Pair<ixy::Pair<ixy::Pair<ixy::Pair<ixy::Pair<ixy::Pair<ixy::None,_const_char_*>,_const_unsigned_int_&>,_const_char_*>,_const_unsigned_long_&>,_const_char_*>,_const_unsigned_int_&>_>
                          *)&local_68);
              local_68.list.first._0_8_ = 0;
              local_68.list.first.second = (char *)0x989680;
              do {
                iVar4 = nanosleep((timespec *)&local_68,(timespec *)&local_68);
                if (iVar4 != -1) break;
                piVar5 = __errno_location();
              } while (*piVar5 == 4);
              local_78 = *(uint *)(this->addr + local_70);
            } while ((local_74 & ~local_78) != 0);
          }
          return;
        }
      }
    }
    __assert_fail("reg <= len - 4",
                  "/workspace/llm4binary/github/license_c_cmakelists/ixy-languages[P]ixy/src/ixgbe.cpp"
                  ,0x1d2,"void ixy::IxgbeDevice::set_reg32(uint64_t, uint32_t)");
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_0010782c:
  __assert_fail("reg <= len - 4",
                "/workspace/llm4binary/github/license_c_cmakelists/ixy-languages[P]ixy/src/ixgbe.cpp"
                ,0x1cb,"uint32_t ixy::IxgbeDevice::get_reg32(uint64_t)");
}

Assistant:

void IxgbeDevice::start_tx_queue(uint16_t queue_id) {
    debug("starting tx queue " << queue_id);
    struct ixgbe_tx_queue *queue = &tx_queues.at(queue_id);
    if (queue->num_entries & unsigned(queue->num_entries - 1)) {
        error("number of queue entries must be a power of 2");
    }
    // tx queue starts out empty
    set_reg32(IXGBE_TDH(queue_id), 0);
    set_reg32(IXGBE_TDT(queue_id), 0);
    // enable queue and wait if necessary
    set_flags32(IXGBE_TXDCTL(queue_id), IXGBE_TXDCTL_ENABLE);
    wait_set_reg32(IXGBE_TXDCTL(queue_id), IXGBE_TXDCTL_ENABLE);
}